

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_headers.h
# Opt level: O3

void __thiscall
cppcms::impl::response_headers::
format_http_headers<cppcms::impl::response_headers::string_buffer_wrapper>
          (response_headers *this,string_buffer_wrapper *io,char *http_version,bool complete)

{
  _Rb_tree_header *p_Var1;
  _List_node_base *p_Var2;
  const_iterator cVar3;
  _Rb_tree_node_base *p_Var4;
  key_type local_50;
  
  std::__cxx11::string::append((char *)io);
  std::__cxx11::string::append((char *)io);
  std::__cxx11::string::append((char *)io);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Status","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  p_Var1 = &(this->headers_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
    std::__cxx11::string::append((char *)io);
  }
  else {
    std::__cxx11::string::_M_append((char *)io,*(ulong *)(cVar3._M_node + 2));
  }
  std::__cxx11::string::append((char *)io);
  for (p_Var4 = (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var4 != cVar3._M_node) {
      std::__cxx11::string::_M_append((char *)io,*(ulong *)(p_Var4 + 1));
      std::__cxx11::string::append((char *)io);
      std::__cxx11::string::_M_append((char *)io,*(ulong *)(p_Var4 + 2));
      std::__cxx11::string::append((char *)io);
    }
  }
  for (p_Var2 = (this->added_headers_).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->added_headers_; p_Var2 = p_Var2->_M_next) {
    std::__cxx11::string::_M_append((char *)io,(ulong)p_Var2[1]._M_next);
    std::__cxx11::string::append((char *)io);
  }
  if (complete) {
    std::__cxx11::string::append((char *)io);
  }
  return;
}

Assistant:

void format_http_headers(IODevice &io,char const *http_version,bool complete) const
	{
		io << "HTTP/" << http_version << " ";;
		auto status_ptr = headers_.find("Status");
		if(status_ptr == headers_.end()) {
			io << "200 Ok";
		}
		else {
			io << status_ptr->second;
		}
		io << "\r\n";
		for(auto p=std::begin(headers_),e=std::end(headers_);p!=e;++p) {
			if(p!=status_ptr)
				io << p->first << ": " << p->second << "\r\n";
		}
		for(auto const &h: added_headers_) {
			io <<  h << "\r\n" ;
		}
		if(complete)
			io << "\r\n";
	}